

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

TracedValue * __thiscall
perfetto::TracedDictionary::AddItem
          (TracedValue *__return_storage_ptr__,TracedDictionary *this,TracedDictionary *param_3,
          undefined8 param_4)

{
  TracedDictionary *__s;
  DebugAnnotation *this_00;
  allocator<char> local_51;
  string local_50;
  DebugAnnotation *local_30;
  DebugAnnotation *item;
  TracedDictionary *this_local;
  DynamicString key_local;
  
  item = (DebugAnnotation *)this;
  this_local = param_3;
  _key_local = param_4;
  this_00 = protozero::Message::BeginNestedMessage<perfetto::protos::pbzero::DebugAnnotation>
                      (this->message_,this->field_id_);
  __s = this_local;
  local_30 = this_00;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,(char *)__s,&local_51);
  protos::pbzero::DebugAnnotation::set_name(this_00,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::allocator<char>::~allocator(&local_51);
  TracedValue::TracedValue
            (__return_storage_ptr__,local_30,this->event_context_,(CheckedScope *)&this->field_0x18)
  ;
  return __return_storage_ptr__;
}

Assistant:

TracedValue TracedDictionary::AddItem(DynamicString key) {
  PERFETTO_DCHECK(checked_scope_.is_active());
  protos::pbzero::DebugAnnotation* item =
      message_->BeginNestedMessage<protos::pbzero::DebugAnnotation>(field_id_);
  item->set_name(key.value);
  return TracedValue(item, event_context_, &checked_scope_);
}